

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

double icu_63::trueAnomaly(double meanAnomaly,double eccentricity)

{
  double dVar1;
  double dVar2;
  undefined8 local_28;
  double E;
  double delta;
  double eccentricity_local;
  double meanAnomaly_local;
  
  local_28 = meanAnomaly;
  do {
    dVar1 = sin(local_28);
    dVar1 = (-eccentricity * dVar1 + local_28) - meanAnomaly;
    dVar2 = cos(local_28);
    local_28 = local_28 - dVar1 / (-eccentricity * dVar2 + 1.0);
    dVar1 = uprv_fabs_63(dVar1);
  } while (1e-05 < dVar1);
  dVar1 = tan(local_28 / 2.0);
  dVar2 = sqrt((eccentricity + 1.0) / (1.0 - eccentricity));
  dVar1 = atan(dVar1 * dVar2);
  return dVar1 * 2.0;
}

Assistant:

static double trueAnomaly(double meanAnomaly, double eccentricity)
{
    // First, solve Kepler's equation iteratively
    // Duffett-Smith, p.90
    double delta;
    double E = meanAnomaly;
    do {
        delta = E - eccentricity * ::sin(E) - meanAnomaly;
        E = E - delta / (1 - eccentricity * ::cos(E));
    }
    while (uprv_fabs(delta) > 1e-5); // epsilon = 1e-5 rad

    return 2.0 * ::atan( ::tan(E/2) * ::sqrt( (1+eccentricity)
                                             /(1-eccentricity) ) );
}